

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uc_priv.h
# Opt level: O0

void hooked_regions_check_single(list_item *cur,uint64_t start,uint64_t length)

{
  uint64_t length_local;
  uint64_t start_local;
  list_item *cur_local;
  
  for (start_local = (uint64_t)cur; start_local != 0; start_local = *(uint64_t *)start_local) {
    if ((((*(ulong *)(*(long *)(start_local + 8) + 0x18) <= start) &&
         (start <= *(ulong *)(*(long *)(start_local + 8) + 0x20))) ||
        (*(ulong *)(*(long *)(start_local + 8) + 0x20) <
         *(ulong *)(*(long *)(start_local + 8) + 0x18))) &&
       ((*(byte *)(*(long *)(start_local + 8) + 0x14) & 1) == 0)) {
      hooked_regions_add(*(hook **)(start_local + 8),start,length);
    }
  }
  return;
}

Assistant:

static inline void hooked_regions_check_single(struct list_item *cur,
                                               uint64_t start, uint64_t length)
{
    while (cur != NULL) {
        if (HOOK_BOUND_CHECK((struct hook *)cur->data, start)) {
            hooked_regions_add((struct hook *)cur->data, start, length);
        }
        cur = cur->next;
    }
}